

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall
roaring::Roaring64Map::iterate(Roaring64Map *this,roaring_iterator64 iterator,void *ptr)

{
  bool bVar1;
  const_iterator r;
  const_iterator iterator_00;
  reference high_bits;
  bool should_continue;
  pair<const_unsigned_int,_roaring::Roaring> *map_entry;
  const_iterator __end2;
  const_iterator __begin2;
  roarings_t *__range2;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  r = std::
      map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
      ::begin(in_stack_ffffffffffffffb8);
  iterator_00 = std::
                map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) {
      return;
    }
    high_bits = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                           *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc7 =
         roaring_iterate64((roaring_bitmap_t *)r._M_node,(roaring_iterator64)iterator_00._M_node,
                           (uint64_t)high_bits,
                           (void *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    if (!(bool)in_stack_ffffffffffffffc7) break;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

void iterate(api::roaring_iterator64 iterator, void *ptr) const {
        for (const auto &map_entry : roarings) {
            bool should_continue =
                roaring_iterate64(&map_entry.second.roaring, iterator,
                                  uint64_t(map_entry.first) << 32, ptr);
            if (!should_continue) {
                break;
            }
        }
    }